

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_GetConstructTypeWorks_Test::~ArenaTest_GetConstructTypeWorks_Test
          (ArenaTest_GetConstructTypeWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, GetConstructTypeWorks) {
  using T = TestAllTypes;
  using Peer = internal::ArenaTestPeer;
  using CT = typename Peer::ConstructType;
  EXPECT_EQ(CT::kDefault, (Peer::GetConstructType<T>()));
  EXPECT_EQ(CT::kCopy, (Peer::GetConstructType<T, const T&>()));
  EXPECT_EQ(CT::kCopy, (Peer::GetConstructType<T, T&>()));
  EXPECT_EQ(CT::kCopy, (Peer::GetConstructType<T, const T&&>()));
  EXPECT_EQ(CT::kMove, (Peer::GetConstructType<T, T&&>()));
  EXPECT_EQ(CT::kUnknown, (Peer::GetConstructType<T, double&>()));
  EXPECT_EQ(CT::kUnknown, (Peer::GetConstructType<T, T&, T&>()));

  // For non-protos, it's always unknown
  EXPECT_EQ(CT::kUnknown, (Peer::GetConstructType<int, const int&>()));
}